

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O3

int WebRtcAgc_VirtualMic
              (void *agcInst,int16_t **in_near,size_t num_bands,size_t samples,int32_t micLevelIn,
              int32_t *micLevelOut)

{
  ushort uVar1;
  short *psVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint16_t uVar6;
  uint uVar7;
  ushort uVar8;
  int iVar9;
  size_t sVar10;
  uint16_t *puVar11;
  size_t sVar12;
  
  uVar7 = 11000;
  if (*agcInst == 8000) {
    uVar7 = 0x157c;
  }
  psVar2 = *in_near;
  if (1 < samples) {
    uVar4 = (int)*psVar2 * (int)*psVar2;
    sVar10 = 1;
    uVar8 = 0;
    do {
      uVar1 = psVar2[sVar10];
      iVar5 = (int)(short)uVar1 * (int)(short)uVar1;
      if (uVar7 <= uVar4) {
        iVar5 = 0;
      }
      uVar4 = iVar5 + uVar4;
      uVar8 = uVar8 - ((short)(uVar1 ^ psVar2[sVar10 - 1]) >> 0xf);
      sVar10 = sVar10 + 1;
    } while (samples != sVar10);
    if (((499 < uVar4) && (5 < (short)uVar8)) &&
       ((uVar8 < 0x10 || ((uVar7 < uVar4 && (uVar8 < 0x14)))))) {
      *(undefined2 *)((long)agcInst + 0x298) = 0;
      goto LAB_001301f3;
    }
  }
  *(undefined2 *)((long)agcInst + 0x298) = 1;
LAB_001301f3:
  bVar3 = (byte)*(undefined2 *)((long)agcInst + 0x15c);
  iVar5 = micLevelIn << (bVar3 & 0x1f);
  if (iVar5 == *(int *)((long)agcInst + 0x130)) {
    iVar5 = *(int *)((long)agcInst + 0x144);
    if (*(int *)((long)agcInst + 0x13c) < *(int *)((long)agcInst + 0x144)) {
      iVar5 = *(int *)((long)agcInst + 0x13c);
    }
    puVar11 = kSuppressionTableVirtualMic + (uint)-(iVar5 + -0x7f);
    if (0x7f < iVar5) {
      puVar11 = kGainTableVirtualMic + (iVar5 - 0x80);
    }
  }
  else {
    *(int *)((long)agcInst + 0x130) = iVar5;
    *(undefined4 *)((long)agcInst + 0x13c) = 0x7f;
    iVar5 = 0x7f;
    puVar11 = kSuppressionTableVirtualMic;
  }
  if (samples != 0) {
    uVar6 = *puVar11;
    sVar10 = 0;
    do {
      iVar9 = (int)((uint)uVar6 * (int)psVar2[sVar10]) >> 10;
      if (iVar9 < 0x8000) {
        if (iVar9 < -0x8000) {
          if (iVar5 < 0x80) {
            iVar9 = -0x8000;
            goto LAB_001302f9;
          }
          iVar9 = -0x8000;
          goto LAB_001302d6;
        }
      }
      else {
        if (iVar5 < 0x80) {
          iVar9 = 0x7fff;
LAB_001302f9:
          uVar7 = 0x80 - iVar5;
          puVar11 = kSuppressionTableVirtualMic;
        }
        else {
          iVar9 = 0x7fff;
LAB_001302d6:
          uVar7 = iVar5 - 0x80;
          puVar11 = kGainTableVirtualMic;
        }
        iVar5 = iVar5 + -1;
        uVar6 = puVar11[uVar7];
      }
      psVar2[sVar10] = (short)iVar9;
      if (1 < num_bands) {
        sVar12 = 1;
        do {
          iVar9 = (int)((int)in_near[sVar12][sVar10] * (uint)uVar6) >> 10;
          if (0x7ffe < iVar9) {
            iVar9 = 0x7fff;
          }
          if (iVar9 < -0x7fff) {
            iVar9 = -0x8000;
          }
          in_near[sVar12][sVar10] = (int16_t)iVar9;
          sVar12 = sVar12 + 1;
        } while (num_bands != sVar12);
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != samples);
    bVar3 = (byte)*(undefined2 *)((long)agcInst + 0x15c);
  }
  *(int *)((long)agcInst + 0x138) = iVar5;
  *micLevelOut = iVar5 >> (bVar3 & 0x1f);
  iVar5 = WebRtcAgc_AddMic(agcInst,in_near,num_bands,samples);
  return -(uint)(iVar5 != 0);
}

Assistant:

int WebRtcAgc_VirtualMic(void *agcInst, int16_t *const *in_near, size_t num_bands, size_t samples, int32_t micLevelIn,
                         int32_t *micLevelOut) {
    int32_t tmpFlt, micLevelTmp, gainIdx;
    uint16_t gain;
    size_t ii, j;
    LegacyAgc *stt;

    uint32_t nrg;
    size_t sampleCntr;
    uint32_t frameNrg = 0;
    uint32_t frameNrgLimit = 5500;
    int16_t numZeroCrossing = 0;
    const int16_t kZeroCrossingLowLim = 15;
    const int16_t kZeroCrossingHighLim = 20;

    stt = (LegacyAgc *) agcInst;

    /*
     *  Before applying gain decide if this is a low-level signal.
     *  The idea is that digital AGC will not adapt to low-level
     *  signals.
     */
    if (stt->fs != 8000) {
        frameNrgLimit = frameNrgLimit << 1;
    }

    frameNrg = (uint32_t)(in_near[0][0] * in_near[0][0]);
    for (sampleCntr = 1; sampleCntr < samples; sampleCntr++) {
        // increment frame energy if it is less than the limit
        // the correct value of the energy is not important
        if (frameNrg < frameNrgLimit) {
            nrg = (uint32_t)(in_near[0][sampleCntr] * in_near[0][sampleCntr]);
            frameNrg += nrg;
        }

        // Count the zero crossings
        numZeroCrossing += ((in_near[0][sampleCntr] ^ in_near[0][sampleCntr - 1]) < 0);
    }

    if ((frameNrg < 500) || (numZeroCrossing <= 5)) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing <= kZeroCrossingLowLim) {
        stt->lowLevelSignal = 0;
    } else if (frameNrg <= frameNrgLimit) {
        stt->lowLevelSignal = 1;
    } else if (numZeroCrossing >= kZeroCrossingHighLim) {
        stt->lowLevelSignal = 1;
    } else {
        stt->lowLevelSignal = 0;
    }

    micLevelTmp = micLevelIn << stt->scale;
    /* Set desired level */
    gainIdx = stt->micVol;
    if (stt->micVol > stt->maxAnalog) {
        gainIdx = stt->maxAnalog;
    }
    if (micLevelTmp != stt->micRef) {
        /* Something has happened with the physical level, restart. */
        stt->micRef = micLevelTmp;
        stt->micVol = 127;
        *micLevelOut = 127;
        stt->micGainIdx = 127;
        gainIdx = 127;
    }
    /* Pre-process the signal to emulate the microphone level. */
    /* Take one step at a time in the gain table. */
    if (gainIdx > 127) {
        gain = kGainTableVirtualMic[gainIdx - 128];
    } else {
        gain = kSuppressionTableVirtualMic[127 - gainIdx];
    }
    for (ii = 0; ii < samples; ii++) {
        tmpFlt = (in_near[0][ii] * gain) >> 10;
        if (tmpFlt > 32767) {
            tmpFlt = 32767;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        if (tmpFlt < -32768) {
            tmpFlt = -32768;
            gainIdx--;
            if (gainIdx >= 127) {
                gain = kGainTableVirtualMic[gainIdx - 127];
            } else {
                gain = kSuppressionTableVirtualMic[127 - gainIdx];
            }
        }
        in_near[0][ii] = (int16_t) tmpFlt;
        for (j = 1; j < num_bands; ++j) {
            tmpFlt = (in_near[j][ii] * gain) >> 10;
            if (tmpFlt > 32767) {
                tmpFlt = 32767;
            }
            if (tmpFlt < -32768) {
                tmpFlt = -32768;
            }
            in_near[j][ii] = (int16_t) tmpFlt;
        }
    }
    /* Set the level we (finally) used */
    stt->micGainIdx = gainIdx;
    //    *micLevelOut = stt->micGainIdx;
    *micLevelOut = stt->micGainIdx >> stt->scale;
    /* Add to Mic as if it was the output from a true microphone */
    if (WebRtcAgc_AddMic(agcInst, in_near, num_bands, samples) != 0) {
        return -1;
    }
    return 0;
}